

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF.h
# Opt level: O0

ChunkHeader Assimp::IFF::LoadChunk(uint8_t **outFile)

{
  ChunkHeader CVar1;
  uint8_t **outFile_local;
  ChunkHeader head;
  
  outFile_local._0_4_ = *(uint32_t *)*outFile;
  *outFile = *outFile + 4;
  outFile_local._4_4_ = *(uint32_t *)*outFile;
  *outFile = *outFile + 4;
  ByteSwap::Swap4((void *)((long)&outFile_local + 4));
  ByteSwap::Swap4(&outFile_local);
  CVar1.length = outFile_local._4_4_;
  CVar1.type = (uint32_t)outFile_local;
  return CVar1;
}

Assistant:

inline ChunkHeader LoadChunk(uint8_t*& outFile)
{
    ChunkHeader head;
    ::memcpy(&head.type, outFile, 4);
    outFile += 4;
    ::memcpy(&head.length, outFile, 4);
    outFile += 4;
    AI_LSWAP4(head.length);
    AI_LSWAP4(head.type);
    return head;
}